

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

void TTA::UpdateTable(uint u,uint v)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar6;
  ulong uVar5;
  
  puVar2 = next_;
  puVar1 = rtable_;
  if (u < v) {
    uVar4 = v;
    uVar3 = u;
    uVar6 = v;
    if (v != 0xffffffff) {
      do {
        puVar1[uVar4] = u;
        uVar5 = (ulong)uVar4;
        uVar4 = puVar2[uVar5];
      } while (puVar2[uVar5] != 0xffffffff);
    }
  }
  else {
    if (u <= v) {
      return;
    }
    uVar3 = v;
    uVar6 = u;
    uVar4 = u;
    if (u != 0xffffffff) {
      do {
        puVar1[uVar4] = v;
        uVar5 = (ulong)uVar4;
        uVar4 = puVar2[uVar5];
      } while (puVar2[uVar5] != 0xffffffff);
    }
  }
  puVar1 = tail_;
  puVar2[tail_[uVar3]] = uVar6;
  puVar1[uVar3] = puVar1[uVar6];
  return;
}

Assistant:

static void UpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
        }
    }